

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O2

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,Point2 *pred,Point2 *corr)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  VectorD<int,_2> *in_RCX;
  uint uVar4;
  array<unsigned_int,_2UL> local_60;
  VectorD<unsigned_int,_2> local_58;
  VectorD<unsigned_int,_2> local_50;
  VectorD<int,_2> *local_48;
  VectorD<unsigned_int,_2> local_40;
  VectorD<int,_2> local_38;
  
  local_38.v_._M_elems[0] = pred[2].v_._M_elems[0];
  local_48 = in_RCX;
  local_38.v_._M_elems[1] = local_38.v_._M_elems[0];
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_58,corr);
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_40,&local_38);
  VectorD<unsigned_int,_2>::operator-(&local_58,&local_40);
  VectorD<int,2>::VectorD<unsigned_int,2>((VectorD<int,_2> *)&local_60,&local_50);
  uVar1 = local_60._M_elems[0];
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  uVar3 = local_60._M_elems[1];
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  *(_Type *)(corr->v_)._M_elems = local_60._M_elems;
  uVar3 = pred[2].v_._M_elems[0];
  if (uVar3 < uVar1 + uVar4) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)corr,(corr->v_)._M_elems + 1);
  }
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_50,corr);
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_58,local_48);
  VectorD<unsigned_int,_2>::operator+(&local_50,&local_58);
  VectorD<int,2>::VectorD<unsigned_int,2>
            ((VectorD<int,_2> *)this,(VectorD<unsigned_int,_2> *)&local_60);
  iVar2 = OctahedronToolBox::ModMax
                    ((OctahedronToolBox *)pred,
                     (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).
                     octahedron_tool_box_.quantization_bits_);
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = iVar2;
  iVar2 = OctahedronToolBox::ModMax
                    ((OctahedronToolBox *)pred,
                     (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).
                     octahedron_tool_box_.max_quantized_value_);
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  max_quantized_value_ = iVar2;
  if (uVar3 < uVar1 + uVar4) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)this,
               &(this->super_PredictionSchemeNormalOctahedronTransformBase<int>).
                octahedron_tool_box_.max_quantized_value_);
  }
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_58,(VectorD<int,_2> *)this);
  VectorD<unsigned_int,2>::VectorD<int,2>(&local_40,&local_38);
  VectorD<unsigned_int,_2>::operator+(&local_58,&local_40);
  VectorD<int,2>::VectorD<unsigned_int,2>((VectorD<int,_2> *)&local_60,&local_50);
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  quantization_bits_ = local_60._M_elems[0];
  (this->super_PredictionSchemeNormalOctahedronTransformBase<int>).octahedron_tool_box_.
  max_quantized_value_ = local_60._M_elems[1];
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, const Point2 &corr) const {
    const Point2 t(this->center_value(), this->center_value());
    typedef typename std::make_unsigned<DataTypeT>::type UnsignedDataTypeT;
    typedef VectorD<UnsignedDataTypeT, 2> Point2u;

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    pred = Point2(Point2u(pred) - Point2u(t));

    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    Point2 orig(Point2u(pred) + Point2u(corr));

    orig[0] = this->ModMax(orig[0]);
    orig[1] = this->ModMax(orig[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }

    // Perform the addition in unsigned type to avoid signed integer overflow.
    // Note that the result will be the same (for non-overflowing values).
    orig = Point2(Point2u(orig) + Point2u(t));
    return orig;
  }